

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_threads.cc
# Opt level: O0

void __thiscall AllReduceSync::waitForSynchronization(AllReduceSync *this)

{
  anon_class_16_2_5231d8f2 __p;
  unique_lock<std::mutex> *in_RDI;
  bool current_run;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  AllReduceSync *in_stack_ffffffffffffffc8;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffc0,(mutex_type *)in_RDI);
  *(int *)&in_RDI[1]._M_owns = *(int *)&in_RDI[1]._M_owns + 1;
  if ((mutex_type *)(ulong)*(uint *)&in_RDI[1]._M_owns < in_RDI[1]._M_device) {
    __p._8_8_ = in_RDI;
    __p.this = in_stack_ffffffffffffffc8;
    std::condition_variable::wait<AllReduceSync::waitForSynchronization()::__0>
              ((condition_variable *)in_stack_ffffffffffffffc0,in_RDI,__p);
  }
  else {
    std::condition_variable::notify_all();
    *(undefined4 *)&in_RDI[1]._M_owns = 0;
    in_RDI[1].field_0xc = (in_RDI[1].field_0xc ^ 0xff) & 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void AllReduceSync::waitForSynchronization()
{
  unique_lock<mutex> l(*m_mutex);
  m_count++;

  if (m_count >= m_total)
  {
    assert(m_count == m_total);

    m_cv->notify_all();

    // order of m_count before or after notify_all doesn't matter
    // since the lock is still hold at this point in time.
    m_count = 0;

    // flip for the next run
    m_run = !m_run;
  }
  else
  {
    bool current_run = m_run;
    // this predicate cannot depend on m_count, as somebody can race ahead and m_count++
    // FYI just wait can spuriously wake-up
    m_cv->wait(l, [this, current_run] { return m_run != current_run; });
  }
}